

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.h
# Opt level: O1

vec3 __thiscall polyscope::render::ValueColorMap::getValue(ValueColorMap *this,double val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pvVar5;
  double dVar6;
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  float fVar13;
  undefined1 in_ZMM2 [64];
  vec3 vVar14;
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = val;
  if (0x7fefffffffffffff < (ulong)ABS(val)) {
    return (vec3)(ZEXT412(0) << 0x40);
  }
  auVar11 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar12._0_16_);
  auVar11 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar11);
  pvVar5 = (this->values).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->values).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
  auVar7 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,(lVar9 >> 2) * -0x5555555555555555 + -1);
  dVar6 = auVar11._0_8_ * auVar7._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6;
  auVar11 = vroundsd_avx(auVar11,auVar11,9);
  dVar6 = dVar6 - auVar11._0_8_;
  iVar8 = vcvttsd2usi_avx512f(auVar11);
  lVar9 = CONCAT44((int)(lVar9 >> 0x22),iVar8);
  fVar13 = (float)(1.0 - dVar6);
  fVar10 = (float)dVar6;
  uVar1 = pvVar5[lVar9].field_0;
  uVar3 = pvVar5[lVar9].field_1;
  uVar2 = pvVar5[iVar8 + 1U].field_0;
  uVar4 = pvVar5[iVar8 + 1U].field_1;
  vVar14.field_0 = (float)uVar2 * fVar10 + (float)uVar1 * fVar13;
  vVar14.field_1 = (float)uVar4 * fVar10 + (float)uVar3 * fVar13;
  vVar14.field_2.z = fVar10 * pvVar5[iVar8 + 1U].field_2.z + fVar13 * pvVar5[lVar9].field_2.z;
  return vVar14;
}

Assistant:

glm::vec3 getValue(double val) const {
    if (!std::isfinite(val)) {
      return {0, 0, 0};
    }

    val = glm::clamp(val, 0.0, 1.0);

    // Find the two nearest indices in to the colormap lookup table, then
    // return a linear blend between them.
    double scaledVal = val * (values.size() - 1);
    double lowerVal = std::floor(scaledVal);
    double upperBlendVal = scaledVal - lowerVal;
    unsigned int lowerInd = static_cast<unsigned int>(lowerVal);
    unsigned int upperInd = lowerInd + 1;

    return (float)(1.0 - upperBlendVal) * values[lowerInd] + (float)upperBlendVal * values[upperInd];
  }